

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Type dg::vr::Relations::inverted(Type type)

{
  undefined4 in_EDI;
  Type local_4;
  
  switch(in_EDI) {
  case 0:
    local_4 = EQ;
    break;
  case 1:
    local_4 = NE;
    break;
  case 2:
    local_4 = SGE;
    break;
  case 3:
    local_4 = SGT;
    break;
  case 4:
    local_4 = UGE;
    break;
  case 5:
    local_4 = UGT;
    break;
  case 6:
    local_4 = SLE;
    break;
  case 7:
    local_4 = SLT;
    break;
  case 8:
    local_4 = ULE;
    break;
  case 9:
    local_4 = ULT;
    break;
  case 10:
    local_4 = PF;
    break;
  case 0xb:
    local_4 = PT;
    break;
  default:
    abort();
  }
  return local_4;
}

Assistant:

Relations::Type Relations::inverted(Relations::Type type) {
    switch (type) {
    case EQ:
        return EQ;
    case NE:
        return NE;
    case SLE:
        return SGE;
    case SLT:
        return SGT;
    case ULE:
        return UGE;
    case ULT:
        return UGT;
    case SGE:
        return SLE;
    case SGT:
        return SLT;
    case UGE:
        return ULE;
    case UGT:
        return ULT;
    case PT:
        return PF;
    case PF:
        return PT;
    }
    assert(0 && "unreachable");
    abort();
}